

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O2

bool tinyusdz::tydra::GetAttribute(Prim *prim,string *attr_name,Attribute *out_attr,string *err)

{
  bool bVar1;
  ostream *poVar2;
  string *args;
  ostringstream ss_e_1;
  Property prop;
  allocator local_7c1;
  string local_7c0;
  string local_7a0 [32];
  ostringstream local_780 [376];
  Property local_608;
  
  if (out_attr == (Attribute *)0x0) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_608);
    poVar2 = ::std::operator<<((ostream *)&local_608,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"GetAttribute");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x7ea);
    ::std::operator<<(poVar2," ");
    poVar2 = ::std::operator<<((ostream *)&local_608,"`out_attr` argument is nullptr.");
    ::std::operator<<(poVar2,"\n");
    if (err != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::append((string *)err);
      ::std::__cxx11::string::_M_dispose();
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_608);
    return false;
  }
  Property::Property(&local_608);
  args = err;
  bVar1 = GetProperty(prim,attr_name,&local_608,err);
  if (bVar1) {
    if (local_608._type < Relation) {
      Attribute::operator=(out_attr,&local_608._attrib);
      bVar1 = true;
      goto LAB_0028d645;
    }
    ::std::__cxx11::ostringstream::ostringstream(local_780);
    poVar2 = ::std::operator<<((ostream *)local_780,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"GetAttribute");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x7f8);
    ::std::operator<<(poVar2," ");
    ::std::__cxx11::string::string(local_7a0,"{} is not a Attribute.",&local_7c1);
    fmt::format<std::__cxx11::string>
              (&local_7c0,(fmt *)local_7a0,(string *)attr_name,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
    poVar2 = ::std::operator<<((ostream *)local_780,(string *)&local_7c0);
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    if (err != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::append((string *)err);
      ::std::__cxx11::string::_M_dispose();
    }
    ::std::__cxx11::ostringstream::~ostringstream(local_780);
  }
  bVar1 = false;
LAB_0028d645:
  Property::~Property(&local_608);
  return bVar1;
}

Assistant:

bool GetAttribute(const tinyusdz::Prim &prim, const std::string &attr_name,
                  Attribute *out_attr, std::string *err) {
  if (!out_attr) {
    PUSH_ERROR_AND_RETURN("`out_attr` argument is nullptr.");
  }

  // First lookup as Property, then check if its Attribute
  Property prop;
  if (!GetProperty(prim, attr_name, &prop, err)) {
    return false;
  }

  if (prop.is_attribute()) {
    (*out_attr) = std::move(prop.get_attribute());
    return true;
  }

  PUSH_ERROR_AND_RETURN(fmt::format("{} is not a Attribute.", attr_name));
}